

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void iterate_md5_digest(MD5 *md5,Digest *digest,int iterations,int key_len)

{
  int iVar1;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t n;
  type ii;
  Digest *d;
  MD5 m;
  MD5 MStack_38;
  
  iVar1 = key_len;
  d = digest;
  MD5::digest(md5,*digest);
  if (0 < iterations) {
    n = extraout_RDX;
    do {
      MD5::MD5(&MStack_38,*d,n,(uchar *)CONCAT44(in_register_0000000c,iVar1));
      if (key_len < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(key_len);
      }
      MD5::encodeDataIncrementally(&MStack_38,(char *)digest,(long)key_len);
      d = digest;
      MD5::digest(&MStack_38,*digest);
      n = extraout_RDX_00;
      if (MStack_38.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (MStack_38.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        n = extraout_RDX_01;
      }
      iterations = iterations + -1;
    } while (iterations != 0);
  }
  return;
}

Assistant:

static void
iterate_md5_digest(MD5& md5, MD5::Digest& digest, int iterations, int key_len)
{
    md5.digest(digest);

    for (int i = 0; i < iterations; ++i) {
        MD5 m;
        m.encodeDataIncrementally(reinterpret_cast<char*>(digest), QIntC::to_size(key_len));
        m.digest(digest);
    }
}